

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

char * Wlc_PrsStrtok(char *s,char *delim)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char cVar4;
  
  if ((s == (char *)0x0) && (s = Wlc_PrsStrtok::last, Wlc_PrsStrtok::last == (char *)0x0)) {
    return (char *)0x0;
  }
  do {
    pcVar1 = s;
    cVar2 = *pcVar1;
    pcVar3 = delim;
    do {
      cVar4 = *pcVar3;
      if (cVar4 == '\0') {
        Wlc_PrsStrtok::last = pcVar1;
        if (cVar2 == '\0') {
          Wlc_PrsStrtok::last = (char *)0x0;
          return (char *)0x0;
        }
        do {
          pcVar3 = delim;
          if (cVar2 == '\\') {
            Wlc_PrsStrtok::last = Wlc_PrsStrtok::last + 2;
            cVar4 = '\\';
            while (cVar2 = Wlc_PrsStrtok::last[-1], cVar4 != ' ') {
              Wlc_PrsStrtok::last = Wlc_PrsStrtok::last + 1;
              cVar4 = cVar2;
            }
          }
          else {
            Wlc_PrsStrtok::last = Wlc_PrsStrtok::last + 1;
          }
          do {
            cVar4 = *pcVar3;
            if (cVar4 == cVar2) {
              if (cVar2 == '\0') {
                Wlc_PrsStrtok::last = (char *)0x0;
              }
              else {
                Wlc_PrsStrtok::last[-1] = '\0';
              }
              return pcVar1;
            }
            pcVar3 = pcVar3 + 1;
          } while (cVar4 != '\0');
          cVar2 = *Wlc_PrsStrtok::last;
        } while( true );
      }
      pcVar3 = pcVar3 + 1;
      s = pcVar1 + 1;
    } while (cVar2 != cVar4);
  } while( true );
}

Assistant:

char * Wlc_PrsStrtok( char * s, const char * delim )
{
  const char *spanp;
  int c, sc;
  char *tok;
  static char *last;
  if (s == NULL && (s = last) == NULL)
      return NULL;
  // skip leading delimiters
cont:
  c = *s++;
  for (spanp = delim; (sc = *spanp++) != 0;) 
      if (c == sc)
          goto cont;
  if (c == 0)    // no non-delimiter characters 
      return (last = NULL);
//  tok = s - 1;
  if ( c != '\\' )
      tok = s - 1;
  else
      tok = s - 1;
  // go back to the first non-delimiter character
  s--;
  // find the token
  for (;;) 
  {
      c = *s++;
      if ( c == '\\' )  // skip blind characters
      {
          while ( c != ' ' )
              c = *s++;
          c = *s++;
      }
      spanp = delim;
      do {
          if ((sc = *spanp++) == c) 
          {
              if (c == 0)
                  s = NULL;
              else
                  s[-1] = 0;
              last = s;
              return (tok);
          }
      } while (sc != 0);
  }
  // not reached
  return NULL;
}